

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence.h
# Opt level: O0

istream * GenApi_3_4::operator>>(istream *is,CFeatureBag *FeatureBag)

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  ExceptionReporter<GenICam_3_4::RuntimeException> *pEVar6;
  gcstring *pgVar7;
  char *pcVar8;
  istream *piVar9;
  istream *piVar10;
  CSelectorState **in_RSI;
  istream *in_RDI;
  gcstring selectorValue;
  gcstring selectorName;
  size_t lhs_len;
  size_t rhs_len;
  size_t ibeg;
  size_t iend;
  size_t iassign;
  CSelectorState *pSelectorState;
  gcstring Value;
  gcstring Name;
  gcstring MagicGUID;
  gcstring FirstLine;
  istream *in_stack_fffffffffffff7a8;
  CSelectorState *in_stack_fffffffffffff7b8;
  CSelectorState **in_stack_fffffffffffff7c0;
  int SourceLine;
  char *in_stack_fffffffffffff7c8;
  ExceptionReporter<GenICam_3_4::RuntimeException> *in_stack_fffffffffffff7d0;
  istream *in_stack_fffffffffffff808;
  istream *in_stack_fffffffffffff810;
  char local_738 [172];
  int local_68c;
  gcstring local_688 [80];
  gcstring local_638 [80];
  gcstring local_5e8 [80];
  gcstring local_598 [80];
  long local_548;
  istream *local_540;
  ulong local_538;
  istream *local_530;
  long local_528;
  undefined1 local_519;
  char local_518 [168];
  long local_470;
  undefined1 local_461;
  char local_460 [168];
  gcstring local_3b8 [80];
  gcstring local_368 [87];
  undefined1 local_311;
  char local_310 [175];
  undefined1 local_261;
  char local_260 [168];
  gcstring local_1b8 [80];
  gcstring local_168 [80];
  gcstring local_118 [83];
  undefined1 local_c5;
  char local_b8 [168];
  CSelectorState **local_10;
  istream *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  uVar3 = std::ios::eof();
  iVar2 = (int)((ulong)in_stack_fffffffffffff7c0 >> 0x20);
  if ((uVar3 & 1) != 0) {
    local_c5 = 1;
    pEVar6 = (ExceptionReporter<GenICam_3_4::RuntimeException> *)__cxa_allocate_exception(0x1f0);
    GenICam_3_4::ExceptionReporter<GenICam_3_4::RuntimeException>::ExceptionReporter
              (in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8,iVar2,
               (char *)in_stack_fffffffffffff7b8);
    GenICam_3_4::ExceptionReporter<GenICam_3_4::RuntimeException>::Report
              (pEVar6,local_b8,"The stream is eof");
    local_c5 = 0;
    __cxa_throw(pEVar6,&GenICam_3_4::RuntimeException::typeinfo,
                GenICam_3_4::RuntimeException::~RuntimeException);
  }
  GenApi_3_4::CFeatureBag::Clear();
  GenICam_3_4::gcstring::gcstring(local_118);
  GenICam_3_4::gcstring::reserve((ulong)local_118);
  GenICam_3_4::getline((char **)local_8,(size_t *)local_118,(FILE *)0xa);
  GenICam_3_4::gcstring::gcstring(local_168,"{05D8C294-F295-4dfb-9D01-096BD04049F4}");
  lVar4 = GenICam_3_4::gcstring::_npos();
  lVar5 = GenICam_3_4::gcstring::find(local_118,(ulong)local_168);
  iVar2 = (int)((ulong)in_stack_fffffffffffff7c0 >> 0x20);
  if (lVar4 == lVar5) {
    GenICam_3_4::gcstring::gcstring(local_1b8,"{4709CB3C-7322-4460-84C3-DA11DDA09939}");
    GenICam_3_4::gcstring::operator=(local_168,local_1b8);
    GenICam_3_4::gcstring::~gcstring(local_1b8);
    lVar4 = GenICam_3_4::gcstring::_npos();
    lVar5 = GenICam_3_4::gcstring::find(local_118,(ulong)local_168);
    if (lVar4 != lVar5) {
      local_311 = 1;
      pEVar6 = (ExceptionReporter<GenICam_3_4::RuntimeException> *)__cxa_allocate_exception(0x1f0);
      GenICam_3_4::ExceptionReporter<GenICam_3_4::RuntimeException>::ExceptionReporter
                (in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8,iVar2,
                 (char *)in_stack_fffffffffffff7b8);
      GenICam_3_4::ExceptionReporter<GenICam_3_4::RuntimeException>::Report
                (pEVar6,local_310,
                 "The stream has been created using the CFeatureBagger class thus must be restored using the CFeatureBagger class as well"
                );
      local_311 = 0;
      __cxa_throw(pEVar6,&GenICam_3_4::RuntimeException::typeinfo,
                  GenICam_3_4::RuntimeException::~RuntimeException);
    }
    local_261 = 1;
    pEVar6 = (ExceptionReporter<GenICam_3_4::RuntimeException> *)__cxa_allocate_exception(0x1f0);
    GenICam_3_4::ExceptionReporter<GenICam_3_4::RuntimeException>::ExceptionReporter
              (in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8,iVar2,
               (char *)in_stack_fffffffffffff7b8);
    GenICam_3_4::ExceptionReporter<GenICam_3_4::RuntimeException>::Report
              (pEVar6,local_260,
               "The stream is not a GenApi feature stream since it is missing the magic GUID in the first line"
              );
    local_261 = 0;
    __cxa_throw(pEVar6,&GenICam_3_4::RuntimeException::typeinfo,
                GenICam_3_4::RuntimeException::~RuntimeException);
  }
  EatComments(in_stack_fffffffffffff7a8);
  GenICam_3_4::gcstring::gcstring(local_368);
  GenICam_3_4::gcstring::gcstring(local_3b8);
  GenICam_3_4::gcstring::reserve((ulong)local_368);
  GenICam_3_4::gcstring::reserve((ulong)local_3b8);
  while (bVar1 = std::ios::eof(), ((bVar1 ^ 0xff) & 1) != 0) {
    GenICam_3_4::getline((char **)local_8,(size_t *)local_368,(FILE *)0x9);
    bVar1 = std::ios::fail();
    iVar2 = (int)((ulong)in_stack_fffffffffffff7c0 >> 0x20);
    if ((bVar1 & 1) != 0) {
      local_461 = 1;
      pEVar6 = (ExceptionReporter<GenICam_3_4::RuntimeException> *)__cxa_allocate_exception(0x1f0);
      GenICam_3_4::ExceptionReporter<GenICam_3_4::RuntimeException>::ExceptionReporter
                (in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8,iVar2,
                 (char *)in_stack_fffffffffffff7b8);
      GenICam_3_4::ExceptionReporter<GenICam_3_4::RuntimeException>::Report
                (pEVar6,local_460,"The stream holds excess data");
      local_461 = 0;
      __cxa_throw(pEVar6,&GenICam_3_4::RuntimeException::typeinfo,
                  GenICam_3_4::RuntimeException::~RuntimeException);
    }
    pgVar7 = TrimSpace((gcstring *)in_stack_fffffffffffff810,in_stack_fffffffffffff808);
    GenICam_3_4::gcstring::operator=(local_368,pgVar7);
    bVar1 = GenICam_3_4::gcstring::empty();
    if ((bVar1 & 1) == 0) {
      local_470 = GenApi_3_4::CFeatureBag::AllocateSelector();
      iVar2 = (int)((ulong)in_stack_fffffffffffff7c0 >> 0x20);
      if (local_470 == 0) {
        local_519 = 1;
        pEVar6 = (ExceptionReporter<GenICam_3_4::RuntimeException> *)__cxa_allocate_exception(0x1f0)
        ;
        GenICam_3_4::ExceptionReporter<GenICam_3_4::RuntimeException>::ExceptionReporter
                  (in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8,iVar2,
                   (char *)in_stack_fffffffffffff7b8);
        GenICam_3_4::ExceptionReporter<GenICam_3_4::RuntimeException>::Report
                  (pEVar6,local_518,"Unable to allocate SelectorState");
        local_519 = 0;
        __cxa_throw(pEVar6,&GenICam_3_4::RuntimeException::typeinfo,
                    GenICam_3_4::RuntimeException::~RuntimeException);
      }
      iVar2 = std::istream::peek();
      SourceLine = (int)((ulong)in_stack_fffffffffffff7c0 >> 0x20);
      if (iVar2 == 0x7b) {
        GenICam_3_4::getline((char **)local_8,(size_t *)local_3b8,(FILE *)0x9);
        bVar1 = std::ios::fail();
        if ((bVar1 & 1) != 0) break;
        local_528 = GenICam_3_4::gcstring::find_last_of((char)local_3b8,0x3d);
        while( true ) {
          lVar4 = local_528;
          lVar5 = GenICam_3_4::gcstring::_npos();
          SourceLine = (int)((ulong)in_stack_fffffffffffff7c0 >> 0x20);
          if (lVar4 == lVar5) break;
          local_530 = (istream *)GenICam_3_4::gcstring::find_last_of((char)local_3b8,0x7d);
          pcVar8 = GenICam_3_4::gcstring::operator_cast_to_char_(local_3b8);
          local_538 = (ulong)(*pcVar8 == '{');
          in_stack_fffffffffffff810 = local_530;
          piVar9 = (istream *)GenICam_3_4::gcstring::_npos();
          in_stack_fffffffffffff808 = local_530;
          if (in_stack_fffffffffffff810 != piVar9) {
            in_stack_fffffffffffff808 = local_530 + (-1 - local_528);
          }
          local_548 = local_528 - local_538;
          local_540 = in_stack_fffffffffffff808;
          GenICam_3_4::gcstring::substr((ulong)local_598,(ulong)local_3b8);
          GenICam_3_4::gcstring::substr((ulong)local_5e8,(ulong)local_3b8);
          lVar4 = local_470;
          GenICam_3_4::gcstring::gcstring(local_638,local_598);
          GenICam_3_4::gcstring::gcstring(local_688,local_5e8);
          GenApi_3_4::CSelectorState::AddSelector(lVar4,local_638,local_688);
          GenICam_3_4::gcstring::~gcstring(local_688);
          GenICam_3_4::gcstring::~gcstring(local_638);
          piVar9 = local_530;
          piVar10 = (istream *)GenICam_3_4::gcstring::_npos();
          if (piVar9 == piVar10) {
            GenICam_3_4::getline((char **)local_8,(size_t *)local_3b8,(FILE *)0x9);
            bVar1 = std::ios::fail();
            if ((bVar1 & 1) == 0) {
              local_68c = 0;
            }
            else {
              local_68c = 4;
            }
          }
          else {
            local_68c = 4;
          }
          GenICam_3_4::gcstring::~gcstring(local_5e8);
          GenICam_3_4::gcstring::~gcstring(local_598);
          SourceLine = (int)((ulong)in_stack_fffffffffffff7c0 >> 0x20);
          if (local_68c != 0) break;
          local_528 = GenICam_3_4::gcstring::find_last_of((char)local_3b8,0x3d);
        }
      }
      GenICam_3_4::getline((char **)local_8,(size_t *)local_3b8,(FILE *)0xa);
      bVar1 = GenICam_3_4::gcstring::empty();
      if ((bVar1 & 1) != 0) {
        GenApi_3_4::CFeatureBag::DeleteSelector(local_10);
        pEVar6 = (ExceptionReporter<GenICam_3_4::RuntimeException> *)__cxa_allocate_exception(0x1f0)
        ;
        GenICam_3_4::ExceptionReporter<GenICam_3_4::RuntimeException>::ExceptionReporter
                  (pEVar6,in_stack_fffffffffffff7c8,SourceLine,(char *)in_stack_fffffffffffff7b8);
        GenICam_3_4::ExceptionReporter<GenICam_3_4::RuntimeException>::Report
                  (pEVar6,local_738,"The stream holds incomplete key - value - set");
        __cxa_throw(pEVar6,&GenICam_3_4::RuntimeException::typeinfo,
                    GenICam_3_4::RuntimeException::~RuntimeException);
      }
      in_stack_fffffffffffff7c0 = local_10;
      in_stack_fffffffffffff7c8 = (char *)GenICam_3_4::gcstring::c_str();
      in_stack_fffffffffffff7b8 = (CSelectorState *)GenICam_3_4::gcstring::c_str();
      GenApi_3_4::CFeatureBag::Push
                ((char *)in_stack_fffffffffffff7c0,in_stack_fffffffffffff7c8,
                 in_stack_fffffffffffff7b8);
      EatComments(in_stack_fffffffffffff7a8);
    }
  }
  local_68c = 1;
  GenICam_3_4::gcstring::~gcstring(local_3b8);
  GenICam_3_4::gcstring::~gcstring(local_368);
  GenICam_3_4::gcstring::~gcstring(local_168);
  GenICam_3_4::gcstring::~gcstring(local_118);
  return local_8;
}

Assistant:

inline std::istream& operator >>(std::istream &is, CFeatureBag &FeatureBag)
    {
        if( is.eof() )
        {
            throw RUNTIME_EXCEPTION("The stream is eof");
        }

        FeatureBag.Clear();

        GENICAM_NAMESPACE::gcstring FirstLine;
        FirstLine.reserve( 128 );
        GENICAM_NAMESPACE::getline( is, FirstLine, '\n' );
        // Check the magic
        GENICAM_NAMESPACE::gcstring MagicGUID(GENAPI_PERSISTENCE_MAGIC);
        if( GENICAM_NAMESPACE::gcstring::_npos() == FirstLine.find(MagicGUID) )
        {
            MagicGUID = GENICAM_NAMESPACE::gcstring(GENAPI_PERSISTENCE_MAGIC_FEATUREBAGGER);
            if( GENICAM_NAMESPACE::gcstring::_npos() == FirstLine.find(MagicGUID) )
            {
                throw RUNTIME_EXCEPTION("The stream is not a GenApi feature stream since it is missing the magic GUID in the first line");
            }
            throw RUNTIME_EXCEPTION("The stream has been created using the CFeatureBagger class thus must be restored using the CFeatureBagger class as well");
        }

        EatComments( is );

        GENICAM_NAMESPACE::gcstring Name, Value;
        Name.reserve( 128 );
        Value.reserve( 128 );
        while (!is.eof())
        {
            GENICAM_NAMESPACE::getline( is, Name, '\t' );
            if (is.fail())  // if reading from stream failed -> stop reading!
            {
                throw RUNTIME_EXCEPTION( "The stream holds excess data" );
                break;
            }

            Name = TrimSpace( Name, is );
            if (Name.empty())
            {
                continue;
            }

            CSelectorState *pSelectorState = FeatureBag.AllocateSelector();
            if (!pSelectorState)
            {
                throw RUNTIME_EXCEPTION( "Unable to allocate SelectorState" );
            }


            if (is.peek() == '{')
            {
                GENICAM_NAMESPACE::getline( is, Value, '\t' );
                if (is.fail())  // if reading from stream failed -> stop reading!
                {
                    break;
                }
                for (size_t iassign = Value.find_last_of( '=' ); iassign != GENICAM_NAMESPACE::gcstring::_npos(); iassign = Value.find_last_of( '=' ))
                {
                    const size_t iend = Value.find_last_of( '}');
                    const size_t ibeg = (Value[0] == '{') ? 1 : 0;
                    const size_t rhs_len = iend == GENICAM_NAMESPACE::gcstring::_npos() ? iend : iend - iassign - 1;
                    const size_t lhs_len = iassign - ibeg;
                    GENICAM_NAMESPACE::gcstring selectorName = Value.substr( ibeg, lhs_len );
                    GENICAM_NAMESPACE::gcstring selectorValue = Value.substr( iassign + 1, rhs_len );
                    pSelectorState->AddSelector( selectorName, selectorValue );
                    if (iend != GENICAM_NAMESPACE::gcstring::_npos())
                    {
                        break;
                    }

                    GENICAM_NAMESPACE::getline( is, Value, '\t' );
                    if (is.fail())
                    {
                        break;
                    }
                }
            }
            GENICAM_NAMESPACE::getline( is, Value, '\n' );
            if (Value.empty())
            {
                FeatureBag.DeleteSelector(pSelectorState);
                throw RUNTIME_EXCEPTION( "The stream holds incomplete key - value - set" );
            }
            FeatureBag.Push( Name.c_str(), Value.c_str(), pSelectorState );

            EatComments( is );
        }
        return is;
    }